

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O2

ssize_t __thiscall Deserializer::read(Deserializer *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000034;
  Log local_b0;
  Log local_a0;
  Log local_90;
  Log local_80;
  undefined1 local_70 [32];
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_50 [4];
  Log local_30;
  
  sVar3 = (ulong)__buf & 0xffffffff;
  if (read(void*,int)::dump == '\0') {
    iVar2 = __cxa_guard_acquire(&read(void*,int)::dump);
    if (iVar2 != 0) {
      pcVar4 = getenv("RCT_SERIALIZER_DUMP");
      read::dump = pcVar4 != (char *)0x0;
      __cxa_guard_release(&read(void*,int)::dump);
    }
  }
  iVar2 = (int)__buf;
  if (read::dump == true) {
    printf("Reading %d bytes for %s\n",sVar3,this->mKey);
  }
  if (iVar2 == 0) {
    sVar3 = 0;
  }
  else if (this->mData == (char *)0x0) {
    if ((FILE *)this->mFile == (FILE *)0x0) {
      __assert_fail("mFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb9,"int Deserializer::read(void *, int)");
    }
    sVar3 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(long)iVar2,(FILE *)this->mFile);
  }
  else {
    iVar5 = this->mLength;
    iVar1 = this->mPos;
    iVar6 = iVar1 + iVar2;
    if (iVar5 < iVar6) {
      local_50[0].mValue = 1;
      Log::Log((Log *)(local_70 + 0x10),LogLevel::Error,(Flags<LogOutput::LogFlag> *)local_50);
      Log::operator<<(&local_b0,(char *)(local_70 + 0x10));
      Log::addStringStream<int>(&local_a0,(int)&local_b0);
      Log::addStringStream<int>(&local_90,(int)&local_a0);
      Log::addStringStream<int>(&local_80,(int)&local_90);
      Log::operator<<((Log *)local_70,(char)&local_80);
      Rct::backtrace((String *)local_50,-1);
      operator<<(&local_30,(String *)local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
      iVar5 = this->mLength;
      iVar1 = this->mPos;
      iVar6 = iVar1 + iVar2;
    }
    if (iVar5 < iVar6) {
      __assert_fail("mPos + len <= mLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb4,"int Deserializer::read(void *, int)");
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->mData + iVar1,(long)iVar2);
    this->mPos = this->mPos + iVar2;
  }
  return sVar3 & 0xffffffff;
}

Assistant:

int read(void *target, int len)
    {
        static const bool dump = getenv("RCT_SERIALIZER_DUMP");
        if (dump) {
            printf("Reading %d bytes for %s\n", len, mKey);
        }
        if (len) {
            if (mData) {
                if (mPos + len > mLength) {
                    error() << "About to die" << mPos << len << mLength << '\n' << Rct::backtrace();

                }
                assert(mPos + len <= mLength);
                memcpy(target, mData + mPos, len);
                mPos += len;
                return len;
            } else {
                assert(mFile);
                return fread(target, sizeof(char), len, mFile);
            }
        }
        return 0;
    }